

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tet_pliant(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL total_force [3];
  REF_INT local_1d8;
  REF_INT edge;
  REF_INT node_list [100];
  int local_3c [2];
  REF_INT nnode;
  REF_INT max_node;
  REF_INT ixyz;
  REF_NODE ref_node;
  REF_DBL *ideal_location_local;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _max_node = ref_grid->node;
  local_3c[1] = 100;
  ref_node = (REF_NODE)ideal_location;
  ideal_location_local._4_4_ = node;
  pRStack_18 = ref_grid;
  uVar1 = ref_cell_node_list_around(ref_grid->cell[8],node,100,local_3c,&local_1d8);
  if (uVar1 == 0) {
    for (nnode = 0; nnode < 3; nnode = nnode + 1) {
      (&ref_private_macro_code_rss_1 + (long)nnode * 2)[0] = 0;
      (&ref_private_macro_code_rss_1 + (long)nnode * 2)[1] = 0;
    }
    for (total_force[2]._4_4_ = 0; total_force[2]._4_4_ < local_3c[0];
        total_force[2]._4_4_ = total_force[2]._4_4_ + 1) {
      uVar1 = ref_smooth_add_pliant_force
                        (_max_node,ideal_location_local._4_4_,(&local_1d8)[total_force[2]._4_4_],
                         (REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x58f,"ref_smooth_tet_pliant",(ulong)uVar1,"edge");
        return uVar1;
      }
    }
    for (nnode = 0; nnode < 3; nnode = nnode + 1) {
      *(double *)(&ref_node->n + (long)nnode * 2) =
           pRStack_18->adapt->smooth_pliant_alpha *
           *(double *)(&ref_private_macro_code_rss_1 + (long)nnode * 2) +
           _max_node->real[nnode + ideal_location_local._4_4_ * 0xf];
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x589,
           "ref_smooth_tet_pliant",(ulong)uVar1,"node list for pliant tet edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tet_pliant(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *ideal_location) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ixyz;
  REF_INT max_node = 100, nnode;
  REF_INT node_list[100];
  REF_INT edge;
  REF_DBL total_force[3];
  RSS(ref_cell_node_list_around(ref_grid_tet(ref_grid), node, max_node, &nnode,
                                node_list),
      "node list for pliant tet edges");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  for (edge = 0; edge < nnode; edge++) {
    RSS(ref_smooth_add_pliant_force(ref_node, node, node_list[edge],
                                    total_force),
        "edge");
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] =
        ref_node_xyz(ref_node, ixyz, node) +
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  return REF_SUCCESS;
}